

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiIO::AddKeyAnalogEvent(ImGuiIO *this,ImGuiKey key,bool down,float analog_value)

{
  long lVar1;
  ImGuiContext *pIVar2;
  long lVar3;
  ImGuiKeyData *pIVar4;
  ImGuiInputEvent *pIVar5;
  int i;
  bool bVar6;
  undefined1 local_48 [20];
  undefined4 local_34;
  
  pIVar2 = GImGui;
  if (key != 0) {
    if (&GImGui->IO != this) {
      __assert_fail("&g.IO == this && \"Can only add events to current context.\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                    ,0x518,"void ImGuiIO::AddKeyAnalogEvent(ImGuiKey, bool, float)");
    }
    if (0x84 < key - 0x200U) {
      __assert_fail("ImGui::IsNamedKey(key)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                    ,0x519,"void ImGuiIO::AddKeyAnalogEvent(ImGuiKey, bool, float)");
    }
    if (this->BackendUsingLegacyKeyArrays != '\0') {
      if (this->BackendUsingLegacyKeyArrays != -1) {
        __assert_fail("(BackendUsingLegacyKeyArrays == -1 || BackendUsingLegacyKeyArrays == 0) && \"Backend needs to either only use io.AddKeyEvent(), either only fill legacy io.KeysDown[] + io.KeyMap[]. Not both!\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                      ,0x51d,"void ImGuiIO::AddKeyAnalogEvent(ImGuiKey, bool, float)");
      }
      lVar3 = 0;
      while (lVar3 != 0x85) {
        lVar1 = lVar3 + 0x200;
        lVar3 = lVar3 + 1;
        if (this->KeyMap[lVar1] != -1) {
          __assert_fail("KeyMap[n] == -1 && \"Backend needs to either only use io.AddKeyEvent(), either only fill legacy io.KeysDown[] + io.KeyMap[]. Not both!\""
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                        ,0x520,"void ImGuiIO::AddKeyAnalogEvent(ImGuiKey, bool, float)");
        }
      }
    }
    this->BackendUsingLegacyKeyArrays = '\0';
    if (key - 0x269U < 0x18) {
      this->BackendUsingLegacyNavInputArray = false;
    }
    pIVar4 = ImGui::GetKeyData(key);
    if (pIVar4->Down == down) {
      if ((pIVar4->AnalogValue == analog_value) && (!NAN(pIVar4->AnalogValue) && !NAN(analog_value))
         ) {
        i = (pIVar2->InputEventsQueue).Size;
        do {
          bVar6 = false;
          while( true ) {
            if ((i < 1) || (bVar6)) {
              if (!bVar6) {
                return;
              }
              goto LAB_0013ea4f;
            }
            i = i + -1;
            pIVar5 = ImVector<ImGuiInputEvent>::operator[](&pIVar2->InputEventsQueue,i);
            if (pIVar5->Type != ImGuiInputEventType_Key) break;
            pIVar5 = ImVector<ImGuiInputEvent>::operator[](&pIVar2->InputEventsQueue,i);
            bVar6 = (pIVar5->field_2).MouseButton.Button == key;
          }
        } while( true );
      }
    }
LAB_0013ea4f:
    local_34._0_1_ = false;
    local_34._1_3_ = 0;
    local_48._0_4_ = ImGuiInputEventType_Key;
    local_48._4_4_ = (key - 0x269U < 0x18) + ImGuiInputSource_Keyboard;
    local_48._13_3_ = 0;
    local_48[0xc] = down;
    local_48._16_4_ = analog_value;
    local_48._8_4_ = key;
    ImVector<ImGuiInputEvent>::push_back(&pIVar2->InputEventsQueue,(ImGuiInputEvent *)local_48);
  }
  return;
}

Assistant:

void ImGuiIO::AddKeyAnalogEvent(ImGuiKey key, bool down, float analog_value)
{
    //if (e->Down) { IMGUI_DEBUG_LOG("AddKeyEvent() Key='%s' %d, NativeKeycode = %d, NativeScancode = %d\n", ImGui::GetKeyName(e->Key), e->Down, e->NativeKeycode, e->NativeScancode); }
    if (key == ImGuiKey_None)
        return;
    ImGuiContext& g = *GImGui;
    IM_ASSERT(&g.IO == this && "Can only add events to current context.");
    IM_ASSERT(ImGui::IsNamedKey(key)); // Backend needs to pass a valid ImGuiKey_ constant. 0..511 values are legacy native key codes which are not accepted by this API.

    // Verify that backend isn't mixing up using new io.AddKeyEvent() api and old io.KeysDown[] + io.KeyMap[] data.
#ifndef IMGUI_DISABLE_OBSOLETE_KEYIO
    IM_ASSERT((BackendUsingLegacyKeyArrays == -1 || BackendUsingLegacyKeyArrays == 0) && "Backend needs to either only use io.AddKeyEvent(), either only fill legacy io.KeysDown[] + io.KeyMap[]. Not both!");
    if (BackendUsingLegacyKeyArrays == -1)
        for (int n = ImGuiKey_NamedKey_BEGIN; n < ImGuiKey_NamedKey_END; n++)
            IM_ASSERT(KeyMap[n] == -1 && "Backend needs to either only use io.AddKeyEvent(), either only fill legacy io.KeysDown[] + io.KeyMap[]. Not both!");
    BackendUsingLegacyKeyArrays = 0;
#endif
    if (ImGui::IsGamepadKey(key))
        BackendUsingLegacyNavInputArray = false;

    // Partial filter of duplicates (not strictly needed, but makes data neater in particular for key mods and gamepad values which are most commonly spmamed)
    ImGuiKeyData* key_data = ImGui::GetKeyData(key);
    if (key_data->Down == down && key_data->AnalogValue == analog_value)
    {
        bool found = false;
        for (int n = g.InputEventsQueue.Size - 1; n >= 0 && !found; n--)
            if (g.InputEventsQueue[n].Type == ImGuiInputEventType_Key && g.InputEventsQueue[n].Key.Key == key)
                found = true;
        if (!found)
            return;
    }

    // Add event
    ImGuiInputEvent e;
    e.Type = ImGuiInputEventType_Key;
    e.Source = ImGui::IsGamepadKey(key) ? ImGuiInputSource_Gamepad : ImGuiInputSource_Keyboard;
    e.Key.Key = key;
    e.Key.Down = down;
    e.Key.AnalogValue = analog_value;
    g.InputEventsQueue.push_back(e);
}